

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O1

void __thiscall
lzham::lzcompressor::state::get_full_match_costs
          (state *this,CLZBase *lzbase,uint dict_pos,bit_cost_t *pBitcosts,uint match_dist,
          int min_len,int max_len,uint is_match_model_index)

{
  int iVar1;
  byte bVar2;
  uint uVar3;
  uchar *puVar4;
  long lVar5;
  uint uVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  ulong uVar11;
  
  uVar3 = (this->super_state_base).m_cur_state;
  if (match_dist < 0x1000) {
    uVar6 = (uint)lzbase->m_slot_tab0[match_dist];
  }
  else if (match_dist < 0x100000) {
    uVar6 = (uint)lzbase->m_slot_tab1[match_dist >> 0xb];
  }
  else if (match_dist < 0x1000000) {
    uVar6 = (uint)lzbase->m_slot_tab2[match_dist >> 0x10];
  }
  else if (match_dist < 0x2000000) {
    uVar6 = (match_dist - 0x1000000 >> 0x17) + 0x30;
  }
  else if (match_dist < 0x4000000) {
    uVar6 = (match_dist + 0xfe000000 >> 0x18) + 0x32;
  }
  else {
    uVar6 = (match_dist + 0xfc000000 >> 0x19) + 0x34;
  }
  bVar2 = (lzbase->super_CLZDecompBase).m_lzx_position_extra_bits[uVar6];
  if (bVar2 < 3) {
    lVar5 = (ulong)*(uint *)(gProbCost +
                            (ulong)*(ushort *)((long)this->m_lit_table + (ulong)uVar3 * 2 + -0x7c) *
                            4) +
            (ulong)*(uint *)(gProbCost +
                            (ulong)(0x800 - *(ushort *)
                                             ((long)(&this->super_state_base + 1) +
                                             (ulong)is_match_model_index * 2 + 4)) * 4) +
            (ulong)bVar2 * 0x1000000;
  }
  else {
    uVar11 = 0;
    if (4 < bVar2) {
      uVar11 = (ulong)((uint)bVar2 * 0x1000000 + 0xfc000000);
    }
    lVar5 = (long)(int)((uint)(this->m_dist_lsb_table).super_raw_quasi_adaptive_huffman_data_model.
                              m_code_sizes.m_p
                              [match_dist - (lzbase->super_CLZDecompBase).m_lzx_position_base[uVar6]
                               & (lzbase->super_CLZDecompBase).m_lzx_position_extra_mask[uVar6] &
                               0xf] << 0x18) +
            uVar11 + (ulong)*(uint *)(gProbCost +
                                     (ulong)*(ushort *)
                                             ((long)this->m_lit_table + (ulong)uVar3 * 2 + -0x7c) *
                                     4) +
                     (ulong)*(uint *)(gProbCost +
                                     (ulong)(0x800 - *(ushort *)
                                                      ((long)(&this->super_state_base + 1) +
                                                      (ulong)is_match_model_index * 2 + 4)) * 4);
  }
  if (min_len <= max_len) {
    puVar4 = (this->m_main_table).super_raw_quasi_adaptive_huffman_data_model.m_code_sizes.m_p;
    lVar8 = (long)min_len;
    uVar9 = min_len - 2;
    do {
      lVar10 = lVar5;
      uVar7 = uVar9;
      if (8 < lVar8) {
        lVar10 = (int)((uint)this->m_large_len_table[6 < uVar3].
                             super_raw_quasi_adaptive_huffman_data_model.m_code_sizes.m_p
                             [(int)lVar8 - 9] << 0x18) + lVar5;
        uVar7 = 7;
      }
      pBitcosts[lVar8] = (int)((uint)puVar4[(uVar7 | uVar6 * 8 - 8) + 2] << 0x18) + lVar10;
      lVar8 = lVar8 + 1;
      iVar1 = uVar9 - max_len;
      uVar9 = uVar9 + 1;
    } while (iVar1 != -2);
  }
  return;
}

Assistant:

void lzcompressor::state::get_full_match_costs(CLZBase& lzbase, uint dict_pos, bit_cost_t *pBitcosts, uint match_dist, int min_len, int max_len, uint is_match_model_index) const
   {
      dict_pos;
      LZHAM_ASSERT(min_len >= cMinMatchLen);

      bit_cost_t cost = m_is_match_model[is_match_model_index].get_cost(1);

      cost += m_is_rep_model[m_cur_state].get_cost(0);

      uint match_slot, match_extra;
      lzbase.compute_lzx_position_slot(match_dist, match_slot, match_extra);
      LZHAM_ASSERT(match_slot >= CLZBase::cLZXLowestUsableMatchSlot && (match_slot < lzbase.m_num_lzx_slots));

      uint num_extra_bits = lzbase.m_lzx_position_extra_bits[match_slot];

      if (num_extra_bits < 3)
         cost += (num_extra_bits << cBitCostScaleShift);
      else
      {
         if (num_extra_bits > 4)
            cost += ((num_extra_bits - 4) << cBitCostScaleShift);

         cost += m_dist_lsb_table.get_cost(match_extra & 15);
      }

      uint match_high_sym = match_slot - CLZBase::cLZXLowestUsableMatchSlot;

      const sym_data_model &large_len_table = m_large_len_table[m_cur_state >= CLZBase::cNumLitStates];

      for (int match_len = min_len; match_len <= max_len; match_len++)
      {
         bit_cost_t len_cost = cost;

         uint match_low_sym = 0;
         if (match_len >= 9)
         {
            match_low_sym = 7;
            len_cost += large_len_table.get_cost(match_len - 9);
         }
         else
            match_low_sym = match_len - 2;

         uint main_sym = match_low_sym | (match_high_sym << 3);

         pBitcosts[match_len] = len_cost + m_main_table.get_cost(CLZBase::cLZXNumSpecialLengths + main_sym);
      }
   }